

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_utils.c
# Opt level: O0

RK_S32 mpi_dec_opt_i(void *ctx,char *next)

{
  MpiDecTestCmd *cmd;
  char *next_local;
  void *ctx_local;
  
  if (next == (char *)0x0) {
    _mpp_log_l(2,"mpi_dec_utils","input file is invalid\n",0);
    ctx_local._4_4_ = 0;
  }
  else {
    strncpy((char *)ctx,next,0xff);
    *(undefined4 *)((long)ctx + 0x210) = 1;
    if (*(int *)((long)ctx + 0x200) == 0) {
      name_to_coding_type((char *)ctx,(MppCodingType *)((long)ctx + 0x200));
    }
    ctx_local._4_4_ = 1;
  }
  return ctx_local._4_4_;
}

Assistant:

RK_S32 mpi_dec_opt_i(void *ctx, const char *next)
{
    MpiDecTestCmd *cmd = (MpiDecTestCmd *)ctx;

    if (next) {
        strncpy(cmd->file_input, next, MAX_FILE_NAME_LENGTH - 1);
        cmd->have_input = 1;
        if (!cmd->type)
            name_to_coding_type(cmd->file_input, &cmd->type);
        return 1;
    }

    mpp_err("input file is invalid\n");
    return 0;
}